

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O3

MemoryWriter * spdlog::details::pad_n_join(MemoryWriter *w,int v1,int v2,char sep)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  IntFormatSpec<int,_fmt::AlignTypeSpec<__x00_>,_char> spec;
  IntFormatSpec<int,_fmt::AlignTypeSpec<__x00_>,_char> spec_00;
  
  spec._8_8_ = (ulong)(uint)v1 << 0x20;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::write_int<int,fmt::IntFormatSpec<int,fmt::AlignTypeSpec<(char)0>,char>>
            (&w->super_BasicWriter<char>,v1,spec);
  pBVar1 = (w->super_BasicWriter<char>).buffer_;
  sVar2 = pBVar1->size_;
  if (sVar2 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar2 + 1);
    sVar2 = pBVar1->size_;
  }
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ':';
  spec_00._8_8_ = (ulong)(uint)v2 << 0x20;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.width_ = 2;
  spec_00.super_AlignTypeSpec<__x00_>.super_AlignSpec.super_WidthSpec.fill_ = L'0';
  fmt::BasicWriter<char>::write_int<int,fmt::IntFormatSpec<int,fmt::AlignTypeSpec<(char)0>,char>>
            (&w->super_BasicWriter<char>,v2,spec_00);
  return w;
}

Assistant:

static fmt::MemoryWriter &pad_n_join(fmt::MemoryWriter &w, int v1, int v2, char sep)
{
    w << fmt::pad(v1, 2, '0') << sep << fmt::pad(v2, 2, '0');
    return w;
}